

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall
FormatTest_EnumFormatterUnambiguous_Test::TestBody(FormatTest_EnumFormatterUnambiguous_Test *this)

{
  char *message;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x48;
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)&gtest_ar,"sizeof(f)","0",(unsigned_long *)&local_20,(int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x780,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatTest, EnumFormatterUnambiguous) {
  fmt::formatter<TestEnum> f;
  ASSERT_GE(sizeof(f), 0); // use f to avoid compiler warning
}